

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O0

void pzshape::TPZShapePrism::TransformDerivativeFromRibToPrisma
               (int rib,int num,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  int in_ESI;
  int in_EDI;
  int j;
  double in_stack_ffffffffffffffd0;
  double in_stack_ffffffffffffffd8;
  TPZFMatrix<double> *in_stack_ffffffffffffffe0;
  int local_14;
  
  for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
    dVar1 = *(double *)(gRibTrans3dPrisma1d + (long)in_EDI * 0x18 + 0x10);
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffe0,(int64_t)in_stack_ffffffffffffffd8,
                        (int64_t)in_stack_ffffffffffffffd0);
    dVar2 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffe0,(int64_t)in_stack_ffffffffffffffd8,
                        (int64_t)in_stack_ffffffffffffffd0);
    *pdVar3 = dVar1 * dVar2;
    dVar1 = *(double *)(gRibTrans3dPrisma1d + (long)in_EDI * 0x18 + 8);
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffe0,(int64_t)in_stack_ffffffffffffffd8,
                        (int64_t)in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 = dVar1 * *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffe0,(int64_t)in_stack_ffffffffffffffd8,
                        (int64_t)in_stack_ffffffffffffffd0);
    *pdVar3 = in_stack_ffffffffffffffd0;
    in_stack_ffffffffffffffd8 = *(double *)(gRibTrans3dPrisma1d + (long)in_EDI * 0x18);
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffe0,(int64_t)in_stack_ffffffffffffffd8,
                        (int64_t)in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffe0 = (TPZFMatrix<double> *)(in_stack_ffffffffffffffd8 * *pdVar3);
    pdVar3 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffe0,(int64_t)in_stack_ffffffffffffffd8,
                        (int64_t)in_stack_ffffffffffffffd0);
    *pdVar3 = (double)in_stack_ffffffffffffffe0;
  }
  return;
}

Assistant:

void TPZShapePrism::TransformDerivativeFromRibToPrisma(int rib,int num,TPZFMatrix<REAL> &dphi) {
		for (int j = 0;j<num;j++) {
			dphi(2,j) = gRibTrans3dPrisma1d[rib][2]*dphi(0,j);
			dphi(1,j) = gRibTrans3dPrisma1d[rib][1]*dphi(0,j);
			dphi(0,j) = gRibTrans3dPrisma1d[rib][0]*dphi(0,j);
		}
	}